

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * SyMemBackendRealloc(SyMemBackend *pBackend,void *pOld,sxu32 nByte)

{
  long lVar1;
  SyMemBlock **ppSVar2;
  int iVar3;
  SyMemBlock *pSVar4;
  SyMemBlock *pSVar5;
  SyMemBlock **ppSVar6;
  uint uVar7;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (pOld == (void *)0x0) {
    pSVar5 = (SyMemBlock *)MemBackendAlloc(pBackend,nByte);
  }
  else {
    lVar1 = *(long *)((long)pOld + -0x10);
    ppSVar2 = *(SyMemBlock ***)((long)pOld + -8);
    pSVar5 = (SyMemBlock *)0x0;
    uVar7 = 0;
    while (pSVar4 = (SyMemBlock *)
                    (*pBackend->pMethods->xRealloc)((SyMemBlock *)((long)pOld + -0x10),nByte + 0x10)
          , pSVar4 == (SyMemBlock *)0x0) {
      if ((pBackend->xMemError == (ProcMemError)0x0) || (3 < uVar7)) goto LAB_0010e5f2;
      iVar3 = (*pBackend->xMemError)(pBackend->pUserData);
      uVar7 = uVar7 + 1;
      if (iVar3 != -0x21) goto LAB_0010e5f2;
    }
    if (pSVar4 != (SyMemBlock *)((long)pOld + -0x10)) {
      ppSVar6 = &pBackend->pBlocks;
      if (ppSVar2 != (SyMemBlock **)0x0) {
        ppSVar6 = ppSVar2;
      }
      *ppSVar6 = pSVar4;
      if (lVar1 != 0) {
        *(SyMemBlock **)(lVar1 + 8) = pSVar4;
      }
    }
    pSVar5 = pSVar4 + 1;
  }
LAB_0010e5f2:
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return pSVar5;
}

Assistant:

JX9_PRIVATE void * SyMemBackendRealloc(SyMemBackend *pBackend, void * pOld, sxu32 nByte)
{
	void *pChunk;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend)  ){
		return 0;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	pChunk = MemBackendRealloc(&(*pBackend), pOld, nByte);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return pChunk;
}